

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::HaveStandardAvailable(cmMakefile *this,cmTarget *target,string *lang,string *feature)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((char *)lang);
  if (iVar2 != 0) {
    bVar1 = HaveCxxStandardAvailable(this,target,feature);
    return bVar1;
  }
  bVar1 = HaveCStandardAvailable(this,target,feature);
  return bVar1;
}

Assistant:

bool cmMakefile::HaveStandardAvailable(cmTarget const* target,
                                       std::string const& lang,
                                       const std::string& feature) const
{
  return lang == "C" ? this->HaveCStandardAvailable(target, feature)
                     : this->HaveCxxStandardAvailable(target, feature);
}